

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_demo.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  mbedtls_mpi Q;
  mbedtls_mpi N;
  mbedtls_mpi P;
  mbedtls_mpi E;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi D;
  mbedtls_mpi Z;
  mbedtls_mpi H;
  mbedtls_mpi mStack_e8;
  mbedtls_mpi local_d0;
  mbedtls_mpi local_b8;
  mbedtls_mpi local_a0;
  mbedtls_mpi local_88;
  mbedtls_mpi local_70;
  mbedtls_mpi local_58;
  mbedtls_mpi local_40;
  mbedtls_mpi local_28;
  
  mbedtls_mpi_init(&local_a0);
  mbedtls_mpi_init(&local_b8);
  mbedtls_mpi_init(&mStack_e8);
  mbedtls_mpi_init(&local_d0);
  mbedtls_mpi_init(&local_28);
  mbedtls_mpi_init(&local_58);
  mbedtls_mpi_init(&local_70);
  mbedtls_mpi_init(&local_88);
  mbedtls_mpi_init(&local_40);
  iVar2 = mbedtls_mpi_read_string(&local_b8,10,"2789");
  iVar3 = 1;
  if (iVar2 == 0) {
    iVar2 = mbedtls_mpi_read_string(&mStack_e8,10,"3203");
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_read_string(&local_a0,10,"257");
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_mul_mpi(&local_d0,&local_b8,&mStack_e8);
        if (iVar2 == 0) {
          puts("\n  Public key:\n");
          bVar1 = false;
          iVar2 = mbedtls_mpi_write_file("  N = ",&local_d0,10,(FILE *)0x0);
          if (iVar2 != 0) goto LAB_001022c6;
          bVar1 = false;
          iVar2 = mbedtls_mpi_write_file("  E = ",&local_a0,10,(FILE *)0x0);
          if (iVar2 != 0) goto LAB_001022c6;
          puts("\n  Private key:\n");
          bVar1 = false;
          iVar2 = mbedtls_mpi_write_file("  P = ",&local_b8,10,(FILE *)0x0);
          if (iVar2 != 0) goto LAB_001022c6;
          bVar1 = false;
          iVar2 = mbedtls_mpi_write_file("  Q = ",&mStack_e8,10,(FILE *)0x0);
          if (iVar2 != 0) goto LAB_001022c6;
          iVar2 = mbedtls_mpi_sub_int(&local_b8,&local_b8,1);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_sub_int(&mStack_e8,&mStack_e8,1);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_mul_mpi(&local_28,&local_b8,&mStack_e8);
              if (iVar2 == 0) {
                iVar2 = mbedtls_mpi_inv_mod(&local_58,&local_a0,&local_28);
                if (iVar2 == 0) {
                  bVar1 = false;
                  mbedtls_mpi_write_file("  D = E^-1 mod (P-1)*(Q-1) = ",&local_58,10,(FILE *)0x0);
                  iVar2 = mbedtls_mpi_read_string(&local_70,10,"55555");
                  if (iVar2 == 0) {
                    bVar1 = false;
                    iVar2 = mbedtls_mpi_exp_mod(&local_88,&local_70,&local_a0,&local_d0,
                                                (mbedtls_mpi *)0x0);
                    if (iVar2 == 0) {
                      bVar1 = false;
                      iVar2 = mbedtls_mpi_exp_mod(&local_40,&local_88,&local_58,&local_d0,
                                                  (mbedtls_mpi *)0x0);
                      if (iVar2 == 0) {
                        puts("\n  RSA operation:\n");
                        bVar1 = false;
                        iVar2 = mbedtls_mpi_write_file
                                          ("  X (plaintext)  = ",&local_70,10,(FILE *)0x0);
                        if (iVar2 == 0) {
                          bVar1 = false;
                          iVar2 = mbedtls_mpi_write_file
                                            ("  Y (ciphertext) = X^E mod N = ",&local_88,10,
                                             (FILE *)0x0);
                          if (iVar2 == 0) {
                            bVar1 = false;
                            iVar2 = mbedtls_mpi_write_file
                                              ("  Z (decrypted)  = Y^D mod N = ",&local_40,10,
                                               (FILE *)0x0);
                            if (iVar2 == 0) {
                              putchar(10);
                              bVar1 = true;
                              iVar3 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_001022c6;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_001022c6:
  mbedtls_mpi_free(&local_a0);
  mbedtls_mpi_free(&local_b8);
  mbedtls_mpi_free(&mStack_e8);
  mbedtls_mpi_free(&local_d0);
  mbedtls_mpi_free(&local_28);
  mbedtls_mpi_free(&local_58);
  mbedtls_mpi_free(&local_70);
  mbedtls_mpi_free(&local_88);
  mbedtls_mpi_free(&local_40);
  if (!bVar1) {
    puts("\nAn error occurred.");
  }
  return iVar3;
}

Assistant:

int main( void )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_mpi E, P, Q, N, H, D, X, Y, Z;

    mbedtls_mpi_init( &E ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q ); mbedtls_mpi_init( &N );
    mbedtls_mpi_init( &H ); mbedtls_mpi_init( &D ); mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y );
    mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &P, 10, "2789" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &Q, 10, "3203" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 10,  "257" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &N, &P, &Q ) );

    mbedtls_printf( "\n  Public key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  N = ", &N, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  E = ", &E, 10, NULL ) );

    mbedtls_printf( "\n  Private key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  P = ", &P, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Q = ", &Q, 10, NULL ) );

#if defined(MBEDTLS_GENPRIME)
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P, &P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q, &Q, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P, &Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &D, &E, &H ) );

    mbedtls_mpi_write_file( "  D = E^-1 mod (P-1)*(Q-1) = ",
                    &D, 10, NULL );
#else
    mbedtls_printf("\nTest skipped (MBEDTLS_GENPRIME not defined).\n\n");
#endif
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &X, 10, "55555" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Y, &X, &E, &N, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Z, &Y, &D, &N, NULL ) );

    mbedtls_printf( "\n  RSA operation:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  X (plaintext)  = ", &X, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Y (ciphertext) = X^E mod N = ", &Y, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Z (decrypted)  = Y^D mod N = ", &Z, 10, NULL ) );
    mbedtls_printf( "\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:
    mbedtls_mpi_free( &E ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q ); mbedtls_mpi_free( &N );
    mbedtls_mpi_free( &H ); mbedtls_mpi_free( &D ); mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y );
    mbedtls_mpi_free( &Z );

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_printf( "\nAn error occurred.\n" );
    }

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}